

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

uint32_t mipsdsp_sat32_lshift(uint32_t a,uint8_t s,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  undefined3 in_register_00000031;
  uint uVar2;
  
  if (CONCAT31(in_register_00000031,s) != 0) {
    if ((int)a < 0) {
      uVar2 = ~(-1 << (s & 0x1f)) & a >> (~s & 0x1f) | ~(-1 << (-s & 0x1f)) << (s & 0x1f);
    }
    else {
      uVar2 = a >> (~s & 0x1f);
    }
    if (uVar2 - 1 < 0xfffffffe) {
      pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
      *pbVar1 = *pbVar1 | 0x40;
      return 0x7fffffff - ((int)a >> 0x1f);
    }
    a = a << (s & 0x1f);
  }
  return a;
}

Assistant:

static inline uint32_t mipsdsp_sat32_lshift(uint32_t a, uint8_t s,
                                            CPUMIPSState *env)
{
    uint8_t  sign;
    uint32_t discard;

    if (s == 0) {
        return a;
    } else {
        sign = (a >> 31) & 0x01;
        if (sign != 0) {
            discard = (((0x01 << (32 - s)) - 1) << s) |
                      ((a >> (30 - (s - 1))) & ((0x01 << s) - 1));
        } else {
            discard = a >> (30 - (s - 1));
        }

        if ((discard != 0x00000000) && (discard != 0xFFFFFFFF)) {
            set_DSPControl_overflow_flag(1, 22, env);
            return (sign == 0) ? 0x7FFFFFFF : 0x80000000;
        } else {
            return a << s;
        }
    }
}